

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

int __thiscall simple_thread_pool::ThreadPoolMgr::init(ThreadPoolMgr *this,EVP_PKEY_CTX *ctx)

{
  undefined2 uVar1;
  size_t sVar2;
  int iVar3;
  thread *this_00;
  ThreadHandle *this_01;
  __hashtable *__h;
  element_type *id;
  undefined1 local_60 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  shared_ptr<simple_thread_pool::ThreadHandle> t_handle;
  ThreadPoolMgr *local_38;
  
  uVar1 = *(undefined2 *)(ctx + 0x10);
  (this->myOpt).invokeCanceledTask = (bool)(char)uVar1;
  (this->myOpt).activeWorkerMode = (bool)(char)((ushort)uVar1 >> 8);
  sVar2 = *(size_t *)(ctx + 8);
  (this->myOpt).numInitialThreads = *(size_t *)ctx;
  (this->myOpt).busyWaitingIntervalUs = sVar2;
  LOCK();
  (this->stopSignal)._M_base._M_i = false;
  UNLOCK();
  this_00 = (thread *)operator_new(8);
  t_handle.super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)loop;
  t_handle.super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = this;
  std::thread::
  thread<void(simple_thread_pool::ThreadPoolMgr::*)(),simple_thread_pool::ThreadPoolMgr*,void>
            (this_00,(type *)&t_handle,&local_38);
  std::__shared_ptr<std::thread,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<std::thread,void>
            ((__shared_ptr<std::thread,(__gnu_cxx::_Lock_policy)2> *)local_60,this_00);
  std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->loopThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  std::mutex::lock(&this->idleThreadsLock);
  for (id = (element_type *)0x0; id < (element_type *)(this->myOpt).numInitialThreads;
      id = (element_type *)((long)&(id->_M_id)._M_thread + 1)) {
    this_01 = (ThreadHandle *)operator_new(200);
    ThreadHandle::ThreadHandle(this_01,&this->super_ThreadPoolMgrBase,(size_t)id);
    std::__shared_ptr<simple_thread_pool::ThreadHandle,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<simple_thread_pool::ThreadHandle,void>
              ((__shared_ptr<simple_thread_pool::ThreadHandle,(__gnu_cxx::_Lock_policy)2> *)
               &t_handle.
                super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>,
               this_01);
    local_60._0_8_ = id;
    std::__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> *)
               (local_60 + 8),
               &t_handle.
                super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->idleThreads,local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    ThreadHandle::init(t_handle.
                       super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(EVP_PKEY_CTX *)
                               &t_handle.
                                super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>
                      );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t_handle.
                super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&this->idleThreadsLock);
  return iVar3;
}

Assistant:

void init(const ThreadPoolOptions& opt) {
        myOpt = opt;
        stopSignal = false;

        loopThread = std::shared_ptr<std::thread>
                     ( new std::thread( &ThreadPoolMgr::loop, this ) );

        {   std::lock_guard<std::mutex> l(idleThreadsLock);
            for (size_t ii = 0; ii < myOpt.numInitialThreads; ++ii) {
                std::shared_ptr<ThreadHandle> t_handle( new ThreadHandle(this, ii) );
                idleThreads.insert({ii, t_handle});
                t_handle->init(t_handle);
            }
        }
    }